

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalAddOverflowCheck,bool,true,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  hugeint_t hVar9;
  uint64_t in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffb0;
  ulong uVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 8;
      do {
        left_01.upper = in_stack_ffffffffffffffb0;
        left_01.lower = (uint64_t)result_data;
        hVar9.upper = (int64_t)ldata;
        hVar9.lower = in_stack_ffffffffffffff98;
        hVar9 = DecimalAddOverflowCheck::
                Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left_01,hVar9);
        *(uint64_t *)((long)result_data + lVar4 + -8) = hVar9.lower;
        *(int64_t *)((long)&result_data->lower + lVar4) = hVar9.upper;
        lVar4 = lVar4 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = count + 0x3f >> 6;
    uVar2 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar2];
      }
      uVar5 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar5 = count;
      }
      uVar3 = uVar5;
      if (uVar6 != 0) {
        uVar3 = uVar7;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar7 < uVar5) {
            uVar7 = uVar7 << 4 | 8;
            do {
              left.upper = uVar10;
              left.lower = (uint64_t)result_data;
              right.upper = (int64_t)ldata;
              right.lower = in_stack_ffffffffffffff98;
              hVar9 = DecimalAddOverflowCheck::
                      Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left,right);
              *(uint64_t *)((long)result_data + (uVar7 - 8)) = hVar9.lower;
              *(int64_t *)((long)&result_data->lower + uVar7) = hVar9.upper;
              uVar3 = uVar3 + 1;
              uVar7 = uVar7 + 0x10;
            } while (uVar5 != uVar3);
          }
        }
        else if (uVar7 < uVar5) {
          uVar3 = uVar7 << 4 | 8;
          uVar8 = 0;
          do {
            if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
              left_00.upper = uVar10;
              left_00.lower = (uint64_t)result_data;
              right_00.upper = (int64_t)ldata;
              right_00.lower = in_stack_ffffffffffffff98;
              hVar9 = DecimalAddOverflowCheck::
                      Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                (left_00,right_00);
              *(uint64_t *)((long)result_data + (uVar3 - 8)) = hVar9.lower;
              *(int64_t *)((long)&result_data->lower + uVar3) = hVar9.upper;
            }
            uVar8 = uVar8 + 1;
            uVar3 = uVar3 + 0x10;
          } while ((uVar7 - uVar5) + uVar8 != 0);
          uVar3 = uVar7 + uVar8;
        }
      }
      uVar2 = uVar2 + 1;
      uVar7 = uVar3;
    } while (uVar2 != uVar10);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}